

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_find_path_atoms(ly_ctx *ctx,lysc_node *ctx_node,char *path,ly_bool output,ly_set **set)

{
  lysc_node *ctx_00;
  size_t path_len;
  ly_ctx *local_60;
  ly_path *local_50;
  ly_path *p;
  lyxp_expr *expr;
  uint8_t oper;
  ly_set **pplStack_38;
  LY_ERR ret;
  ly_set **set_local;
  char *pcStack_28;
  ly_bool output_local;
  char *path_local;
  lysc_node *ctx_node_local;
  ly_ctx *ctx_local;
  
  expr._4_4_ = 0;
  p = (ly_path *)0x0;
  local_50 = (ly_path *)0x0;
  pplStack_38 = set;
  set_local._7_1_ = output;
  pcStack_28 = path;
  path_local = (char *)ctx_node;
  ctx_node_local = (lysc_node *)ctx;
  if ((ctx == (ly_ctx *)0x0) && (ctx_node == (lysc_node *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx || ctx_node",
           "lys_find_path_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (path == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path","lys_find_path_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (set == (ly_set **)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set","lys_find_path_atoms");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    if (((ctx != (ly_ctx *)0x0) && (ctx_node != (lysc_node *)0x0)) &&
       (ctx_node->module->ctx != (ly_ctx *)0x0)) {
      if (ctx_node == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)0x0;
      }
      else {
        local_60 = ctx_node->module->ctx;
      }
      if (ctx != local_60) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
    }
    if (ctx == (ly_ctx *)0x0) {
      ctx_node_local = (lysc_node *)ctx_node->module->ctx;
    }
    ctx_00 = ctx_node_local;
    path_len = strlen(path);
    expr._4_4_ = ly_path_parse((ly_ctx *)ctx_00,ctx_node,path,path_len,'\0',2,0x40,0x200,
                               (lyxp_expr **)&p);
    if (expr._4_4_ == LY_SUCCESS) {
      expr._3_1_ = 1;
      if (set_local._7_1_ != '\0') {
        expr._3_1_ = 2;
      }
      expr._4_4_ = ly_path_compile((ly_ctx *)ctx_node_local,(lys_module *)0x0,
                                   (lysc_node *)path_local,(lysc_ext_instance *)0x0,(lyxp_expr *)p,
                                   (ushort)expr._3_1_,0x20,'\0',LY_VALUE_JSON,(void *)0x0,&local_50)
      ;
      if (expr._4_4_ == LY_SUCCESS) {
        expr._4_4_ = lys_find_lypath_atoms(local_50,pplStack_38);
      }
    }
    ly_path_free(local_50);
    lyxp_expr_free((ly_ctx *)ctx_node_local,(lyxp_expr *)p);
    ctx_local._4_4_ = expr._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_path_atoms(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *path, ly_bool output,
        struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t oper;
    struct lyxp_expr *expr = NULL;
    struct ly_path *p = NULL;

    LY_CHECK_ARG_RET(ctx, ctx || ctx_node, path, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, ctx_node ? ctx_node->module->ctx : NULL, LY_EINVAL);

    if (!ctx) {
        ctx = ctx_node->module->ctx;
    }

    /* parse */
    ret = ly_path_parse(ctx, ctx_node, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &expr);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile */
    oper = output ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT;
    ret = ly_path_compile(ctx, NULL, ctx_node, NULL, expr, oper, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p);
    LY_CHECK_GOTO(ret, cleanup);

    /* resolve */
    ret = lys_find_lypath_atoms(p, set);

cleanup:
    ly_path_free(p);
    lyxp_expr_free(ctx, expr);
    return ret;
}